

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.cc
# Opt level: O0

void benchmark::BenchmarkReporter::PrintBasicContext(ostream *out_ptr,Context *context)

{
  ostream *poVar1;
  int *in_RSI;
  char *pcVar2;
  ostream *in_RDI;
  ostream *Out;
  undefined8 in_stack_ffffffffffffff80;
  string *psVar3;
  char *in_stack_ffffffffffffff88;
  CheckHandler *this;
  char *in_stack_ffffffffffffff98;
  CheckHandler *in_stack_ffffffffffffffa0;
  string local_58 [32];
  ostream *local_38;
  byte local_19;
  CheckHandler local_18;
  int *local_10;
  ostream *local_8;
  
  local_19 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_RDI == (ostream *)0x0) {
    this = &local_18;
    internal::CheckHandler::CheckHandler
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(char *)this,
               in_stack_ffffffffffffff88,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    local_19 = 1;
    poVar1 = internal::CheckHandler::GetLog(this);
  }
  else {
    poVar1 = internal::GetNullLogInstance();
  }
  std::operator<<(poVar1,"cannot be null");
  if ((local_19 & 1) == 0) {
    local_38 = local_8;
    poVar1 = std::operator<<(local_8,"Run on (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_10);
    poVar1 = std::operator<<(poVar1," X ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(local_10 + 2));
    poVar1 = std::operator<<(poVar1," MHz CPU ");
    pcVar2 = "";
    if (1 < *local_10) {
      pcVar2 = "s";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1,")\n");
    poVar1 = local_38;
    psVar3 = local_58;
    LocalDateTimeString_abi_cxx11_();
    poVar1 = std::operator<<(poVar1,psVar3);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_58);
    if ((*(byte *)(local_10 + 4) & 1) != 0) {
      std::operator<<(local_38,
                      "***WARNING*** CPU scaling is enabled, the benchmark real time measurements may be noisy and will incur extra overhead.\n"
                     );
    }
    std::operator<<(local_38,"***WARNING*** Library was built as DEBUG. Timings may be affected.\n")
    ;
    return;
  }
  internal::CheckHandler::~CheckHandler((CheckHandler *)&LAB_0017c615);
}

Assistant:

void BenchmarkReporter::PrintBasicContext(std::ostream *out_ptr,
                                          Context const &context) {
  CHECK(out_ptr) << "cannot be null";
  auto& Out = *out_ptr;

  Out << "Run on (" << context.num_cpus << " X " << context.mhz_per_cpu
            << " MHz CPU " << ((context.num_cpus > 1) ? "s" : "") << ")\n";

  Out << LocalDateTimeString() << "\n";

  if (context.cpu_scaling_enabled) {
    Out << "***WARNING*** CPU scaling is enabled, the benchmark "
                 "real time measurements may be noisy and will incur extra "
                 "overhead.\n";
  }

#ifndef NDEBUG
  Out << "***WARNING*** Library was built as DEBUG. Timings may be "
               "affected.\n";
#endif
}